

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::EnumColumnWriter::FlushDictionary
          (EnumColumnWriter *this,PrimitiveColumnWriterState *state,ColumnWriterStatistics *stats_p)

{
  LogicalType *pLVar1;
  ClientContext *pCVar2;
  pointer pMVar3;
  char *src;
  const_data_ptr_t pdVar4;
  idx_t iVar5;
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *in_RSI;
  ColumnWriter *in_RDI;
  string_t *in_stack_00000058;
  idx_t r;
  templated_unique_single_t temp_writer;
  string_t *string_values;
  idx_t enum_count;
  Vector *enum_values;
  StringStatisticsState *stats;
  idx_t in_stack_000001f8;
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
  *in_stack_00000200;
  PrimitiveColumnWriterState *in_stack_00000208;
  PrimitiveColumnWriter *in_stack_00000210;
  undefined8 in_stack_ffffffffffffff58;
  WriteStream *in_stack_ffffffffffffff60;
  Allocator *in_stack_ffffffffffffff78;
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> local_60 [3];
  ulong local_48;
  string_t *local_38;
  ulong local_30;
  undefined8 local_28;
  StringStatisticsState *local_20;
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *local_10;
  
  local_10 = in_RSI;
  local_20 = ColumnWriterStatistics::Cast<duckdb::StringStatisticsState>
                       ((ColumnWriterStatistics *)in_stack_ffffffffffffff60);
  pLVar1 = ColumnWriter::Type(in_RDI);
  local_28 = duckdb::EnumType::GetValuesInsertOrder(pLVar1);
  pLVar1 = ColumnWriter::Type(in_RDI);
  local_30 = duckdb::EnumType::GetSize(pLVar1);
  local_38 = FlatVector::GetData<duckdb::string_t>((Vector *)0x86a8cf);
  pCVar2 = ParquetWriter::GetContext(in_RDI->writer);
  duckdb::Allocator::Get(pCVar2);
  make_uniq<duckdb::MemoryStream,duckdb::Allocator&>(in_stack_ffffffffffffff78);
  for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
    StringStatisticsState::Update((StringStatisticsState *)r,in_stack_00000058);
    unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::operator->
              ((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
               in_stack_ffffffffffffff60);
    string_t::GetSize(local_38 + local_48);
    WriteStream::Write<unsigned_int>
              (in_stack_ffffffffffffff60,(uint)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    pMVar3 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
             operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                         *)in_stack_ffffffffffffff60);
    src = string_t::GetData((string_t *)in_stack_ffffffffffffff60);
    pdVar4 = const_data_ptr_cast<char>(src);
    iVar5 = string_t::GetSize(local_38 + local_48);
    (*(code *)**(undefined8 **)pMVar3)(pMVar3,pdVar4,iVar5);
  }
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::unique_ptr
            (local_60,local_10);
  PrimitiveColumnWriter::WriteDictionary
            (in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::~unique_ptr
            ((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             0x86aa52);
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::~unique_ptr
            ((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             0x86aa5c);
  return;
}

Assistant:

void EnumColumnWriter::FlushDictionary(PrimitiveColumnWriterState &state, ColumnWriterStatistics *stats_p) {
	auto &stats = stats_p->Cast<StringStatisticsState>();
	// write the enum values to a dictionary page
	auto &enum_values = EnumType::GetValuesInsertOrder(Type());
	auto enum_count = EnumType::GetSize(Type());
	auto string_values = FlatVector::GetData<string_t>(enum_values);
	// first write the contents of the dictionary page to a temporary buffer
	auto temp_writer = make_uniq<MemoryStream>(Allocator::Get(writer.GetContext()));
	for (idx_t r = 0; r < enum_count; r++) {
		D_ASSERT(!FlatVector::IsNull(enum_values, r));
		// update the statistics
		stats.Update(string_values[r]);
		// write this string value to the dictionary
		temp_writer->Write<uint32_t>(string_values[r].GetSize());
		temp_writer->WriteData(const_data_ptr_cast(string_values[r].GetData()), string_values[r].GetSize());
	}
	// flush the dictionary page and add it to the to-be-written pages
	WriteDictionary(state, std::move(temp_writer), enum_count);
}